

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.cpp
# Opt level: O2

void __thiscall WorkerContext::operator()(WorkerContext *this)

{
  socklen_t __len;
  sockaddr *__addr;
  void *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  socklen_t in_R9D;
  string_view trace;
  string_view trace_00;
  string_view trace_01;
  string_view trace_02;
  string_view trace_03;
  string_view trace_04;
  string_view trace_05;
  string_view_t fmt;
  string_view trace_06;
  string_view trace_07;
  NetAction local_cc;
  socket_t worker;
  context_t context;
  string s;
  Response response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> address;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> request;
  
  zmq::context_t::context_t(&context,1,0x3ff);
  zmq::socket_t::socket_t(&worker,&context,3);
  __len = (socklen_t)(this->identity)._M_string_length;
  zmq::detail::socket_base::setsockopt
            (&worker.super_socket_base,5,(int)(this->identity)._M_dataplus._M_p,__len,in_R8,in_R9D);
  zmq::detail::socket_base::connect(&worker.super_socket_base,0x1d6128,__addr,__len);
  address._M_dataplus._M_p._0_4_ = 0;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  trace._M_str = 
  "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,21)"
  ;
  trace._M_len = 0x67;
  s_send<NetAction>(&worker,(NetAction *)&address,trace,0);
  do {
    trace_00._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,26)"
    ;
    trace_00._M_len = 0x67;
    s_recv<std::__cxx11::string>(&address,&worker,trace_00);
    trace_05._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,28)"
    ;
    trace_05._M_len = 0x67;
    s_recv_padding(&worker,trace_05);
    trace_01._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,31)"
    ;
    trace_01._M_len = 0x67;
    s_recv<std::__cxx11::string>(&request,&worker,trace_01);
    s._M_dataplus._M_p =
         (pointer)((this->task).super__Optional_base<Task,_false,_false>._M_payload.
                   super__Optional_payload<Task,_true,_false,_false>.
                   super__Optional_payload_base<Task>._M_payload._M_value.spec_)->id_;
    fmt.size_ = (size_t)&s;
    fmt.data_ = (char *)0x14;
    spdlog::info<unsigned_long,std::__cxx11::string>
              ((spdlog *)"TASK: start [{}]: {}",fmt,(unsigned_long *)&request,args_1);
    dispatch_command_safe((string *)&response,(Task *)&request,(DatabaseSnapshot *)&this->task);
    Response::to_string_abi_cxx11_(&s,&response);
    local_cc = Response;
    trace_02._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,39)"
    ;
    trace_02._M_len = 0x67;
    s_send<NetAction>(&worker,&local_cc,trace_02,2);
    trace_06._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,40)"
    ;
    trace_06._M_len = 0x67;
    s_send_padding(&worker,trace_06,2);
    trace_03._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,41)"
    ;
    trace_03._M_len = 0x67;
    s_send<std::__cxx11::string>(&worker,&address,trace_03,2);
    trace_07._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,42)"
    ;
    trace_07._M_len = 0x67;
    s_send_padding(&worker,trace_07,2);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    trace_04._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,43)"
    ;
    trace_04._M_len = 0x67;
    s_send<std::__cxx11::string>(&worker,&s,trace_04,0);
    std::__cxx11::string::~string((string *)&s);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&response);
    std::__cxx11::string::~string((string *)&request);
    std::__cxx11::string::~string((string *)&address);
  } while( true );
}

Assistant:

[[noreturn]] void WorkerContext::operator()() {
    zmq::context_t context(1);
    zmq::socket_t worker(context, ZMQ_REQ);

    worker.setsockopt(ZMQ_IDENTITY, identity.c_str(), identity.length());
    worker.connect("ipc://backend.ipc");

    //  Tell backend we're ready for work
    s_send<NetAction>(&worker, NetAction::Ready, ZMQTRACE);

    for (;;) {
        //  Read and save all frames until we get an empty frame
        //  In this example there is only 1 but it could be more
        auto address{s_recv<std::string>(&worker, ZMQTRACE)};

        s_recv_padding(&worker, ZMQTRACE);

        //  Get request, send reply
        auto request{s_recv<std::string>(&worker, ZMQTRACE)};
        spdlog::info("TASK: start [{}]: {}", task->spec().id(), request);

        Response response = dispatch_command_safe(request, &*task, &snap);
        // Note: optionally add funny metadata to response here (like request
        // time, assigned worker, etc)
        std::string s = response.to_string();

        s_send<NetAction>(&worker, NetAction::Response, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&worker, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&worker, address, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&worker, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&worker, s, ZMQTRACE);
    }
}